

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnhandledEngine::findBreaks
          (UnhandledEngine *this,UText *text,int32_t param_2,int32_t endPos,UVector32 *param_4)

{
  UBool UVar1;
  int64_t iVar2;
  bool bVar3;
  UChar32 local_2c;
  UChar32 c;
  UVector32 *param_4_local;
  int32_t endPos_local;
  int32_t param_2_local;
  UText *text_local;
  UnhandledEngine *this_local;
  
  local_2c = utext_current32_63(text);
  while( true ) {
    iVar2 = utext_getNativeIndex_63(text);
    bVar3 = false;
    if ((int)iVar2 < endPos) {
      UVar1 = UnicodeSet::contains(this->fHandled,local_2c);
      bVar3 = UVar1 != '\0';
    }
    if (!bVar3) break;
    utext_next32_63(text);
    local_2c = utext_current32_63(text);
  }
  return 0;
}

Assistant:

int32_t
UnhandledEngine::findBreaks( UText *text,
                             int32_t /* startPos */,
                             int32_t endPos,
                             UVector32 &/*foundBreaks*/ ) const {
    UChar32 c = utext_current32(text); 
    while((int32_t)utext_getNativeIndex(text) < endPos && fHandled->contains(c)) {
        utext_next32(text);            // TODO:  recast loop to work with post-increment operations.
        c = utext_current32(text);
    }
    return 0;
}